

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

int __thiscall BmsNoteManager::GetKeys(BmsNoteManager *this)

{
  int iVar1;
  int local_6c;
  int local_68;
  int i;
  int keycnt [20];
  BmsNoteManager *this_local;
  
  keycnt._72_8_ = this;
  memset(&local_68,0,0x50);
  for (local_6c = 0; local_6c < 0x14; local_6c = local_6c + 1) {
    iVar1 = BmsNoteLane::GetNoteCount(this->lanes_ + local_6c,true,true,false);
    (&local_68)[local_6c] = iVar1;
  }
  if (keycnt[0x10] == 0) {
    if ((keycnt[0xe] == 0) && (keycnt[0xf] == 0)) {
      if ((keycnt[0xd] == 0) &&
         ((((keycnt[0xc] == 0 && (keycnt[0xb] == 0)) && (keycnt[10] == 0)) && (keycnt[9] == 0)))) {
        if (keycnt[6] == 0) {
          if ((keycnt[4] == 0) && (keycnt[5] == 0)) {
            if ((((keycnt[3] == 0) && ((keycnt[2] == 0 && (keycnt[1] == 0)))) && (keycnt[0] == 0))
               && (i == 0)) {
              this_local._4_4_ = 0;
            }
            else {
              this_local._4_4_ = 5;
            }
          }
          else {
            this_local._4_4_ = 7;
          }
        }
        else {
          this_local._4_4_ = 9;
        }
      }
      else {
        this_local._4_4_ = 10;
      }
    }
    else {
      this_local._4_4_ = 0xe;
    }
  }
  else {
    this_local._4_4_ = 0x12;
  }
  return this_local._4_4_;
}

Assistant:

int BmsNoteManager::GetKeys() {
	int keycnt[_MAX_NOTE_LANE] = { 0, };
	for (int i = 0; i < _MAX_NOTE_LANE; i++)
		keycnt[i] = lanes_[i].GetNoteCount();
	
	// check DP first
	if (keycnt[18])
		return 18;
	else if (keycnt[16] || keycnt[17])
		return 14;
	else if (keycnt[15] || keycnt[14] || keycnt[13] || keycnt[12] || keycnt[11])
		return 10;
	else if (keycnt[8])
		return 9;
	else if (keycnt[6] || keycnt[7])
		return 7;
	else if (keycnt[5] || keycnt[4] || keycnt[3] || keycnt[2] || keycnt[1])
		return 5;

	// unknown ..?
	return 0;
}